

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.cpp
# Opt level: O0

string * fs_realpath_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  size_t __n;
  const_pointer __name;
  char *pcVar1;
  __sv_type s;
  allocator<char> local_41;
  string local_40 [8];
  string r;
  string_view path_local;
  
  r.field_2._8_8_ = path._M_len;
  __n = fs_get_max_path();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,__n,'\0',&local_41);
  std::allocator<char>::~allocator(&local_41);
  __name = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)((long)&r.field_2 + 8));
  pcVar1 = (char *)std::__cxx11::string::data();
  pcVar1 = realpath(__name,pcVar1);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    s = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
    fs_trim_abi_cxx11_(__return_storage_ptr__,s);
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_realpath(std::string_view path)
{
  // resolve real path
  // not well-defined for non-existing path--may return empty string.

#ifdef _WIN32
  return fs_win32_final_path(path);
#else
  std::string r(fs_get_max_path(), '\0');

  return realpath(path.data(), r.data())
    ? fs_trim(r)
    : std::string();
#endif

}